

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

QVariant * __thiscall QAssociativeConstIterator::key(QAssociativeConstIterator *this)

{
  long lVar1;
  QBaseIterator<QMetaAssociation> *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c in_stack_00000020;
  QBaseIterator<QMetaAssociation> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QBaseIterator<QMetaAssociation>::metaContainer(in_RDI);
  QMetaAssociation::keyMetaType((QMetaAssociation *)this_00);
  QIterablePrivate::retrieveElement<QAssociativeConstIterator::key()const::__0>
            ((QMetaType)this,in_stack_00000020);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAssociativeConstIterator::key() const
{
    return QIterablePrivate::retrieveElement(
                metaContainer().keyMetaType(), [this](void *dataPtr) {
        metaContainer().keyAtConstIterator(constIterator(), dataPtr);
    });
}